

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

char * loguru::get_verbosity_name(Verbosity verbosity)

{
  char *pcVar1;
  
  if (s_verbosity_to_name_callback == (code *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)(*s_verbosity_to_name_callback)(verbosity);
  }
  if (pcVar1 == (char *)0x0) {
    if (verbosity < -2) {
      pcVar1 = "FATL";
    }
    else if (verbosity + 2U < 3) {
      pcVar1 = (&PTR_anon_var_dwarf_3c7ac_001555a0)[verbosity + 2U];
    }
    else {
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

const char* get_verbosity_name(Verbosity verbosity)
	{
		auto name = s_verbosity_to_name_callback
				? (*s_verbosity_to_name_callback)(verbosity)
				: nullptr;

		// Use standard replacements if callback fails:
		if (!name)
		{
			if (verbosity <= Verbosity_FATAL) {
				name = "FATL";
			} else if (verbosity == Verbosity_ERROR) {
				name = "ERR";
			} else if (verbosity == Verbosity_WARNING) {
				name = "WARN";
			} else if (verbosity == Verbosity_INFO) {
				name = "INFO";
			}
		}

		return name;
	}